

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t create_parent_dir(archive_write_disk *a,char *path)

{
  char *pcVar1;
  wchar_t r;
  char *slash;
  char *path_local;
  archive_write_disk *a_local;
  
  pcVar1 = strrchr(path,0x2f);
  if (pcVar1 == (char *)0x0) {
    a_local._4_4_ = L'\0';
  }
  else {
    *pcVar1 = '\0';
    a_local._4_4_ = create_dir(a,path);
    *pcVar1 = '/';
  }
  return a_local._4_4_;
}

Assistant:

static int
create_parent_dir(struct archive_write_disk *a, char *path)
{
	char *slash;
	int r;

	/* Remove tail element to obtain parent name. */
	slash = strrchr(path, '/');
	if (slash == NULL)
		return (ARCHIVE_OK);
	*slash = '\0';
	r = create_dir(a, path);
	*slash = '/';
	return (r);
}